

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

void copyFile(string *from,string *to)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  ulong *puVar10;
  undefined8 *puVar11;
  char *pcVar12;
  undefined8 uVar13;
  ulong uVar14;
  bool bVar15;
  string command2;
  string command;
  string override_permission;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  string local_170;
  ulong *local_150;
  long local_148;
  ulong local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  ulong *local_130;
  long local_128;
  ulong local_120;
  undefined4 uStack_118;
  undefined4 uStack_114;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  string local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar5 = Settings::canOverwriteFiles();
  sVar3 = from->_M_string_length;
  if (sVar3 == to->_M_string_length) {
    if (sVar3 == 0) {
      bVar15 = true;
    }
    else {
      iVar6 = bcmp((from->_M_dataplus)._M_p,(to->_M_dataplus)._M_p,sVar3);
      bVar15 = iVar6 == 0;
    }
  }
  else {
    bVar15 = false;
  }
  if (!bVar15 && !bVar5) {
    bVar15 = fileExists(to);
    if (bVar15) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"\n\nError : File ");
      poVar9 = std::operator<<(poVar9,(to->_M_dataplus)._M_p);
      poVar9 = std::operator<<(poVar9," already exists. Remove it or enable overwriting.");
      std::endl<char,std::char_traits<char>>(poVar9);
      goto LAB_0011a45c;
    }
  }
  pcVar12 = "-n ";
  if (bVar5) {
    pcVar12 = "-f ";
  }
  local_70[0] = local_60;
  pcVar4 = "-n ";
  if (bVar5) {
    pcVar4 = "-f ";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,pcVar12,pcVar4 + 3);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"cp ","");
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_50,(ulong)local_70[0]);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_120 = *puVar10;
    uStack_118 = (undefined4)plVar7[3];
    uStack_114 = *(undefined4 *)((long)plVar7 + 0x1c);
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar10;
    local_130 = (ulong *)*plVar7;
  }
  local_128 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"\"","");
  uVar14 = 0xf;
  if (local_130 != &local_120) {
    uVar14 = local_120;
  }
  if (uVar14 < (ulong)(local_108 + local_128)) {
    uVar14 = 0xf;
    if (local_110 != local_100) {
      uVar14 = local_100[0];
    }
    if (uVar14 < (ulong)(local_108 + local_128)) goto LAB_00119e81;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_00119e81:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_110);
  }
  local_f0 = &local_e0;
  puVar11 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar11) {
    local_e0 = *puVar11;
    uStack_d8 = puVar8[3];
  }
  else {
    local_e0 = *puVar11;
    local_f0 = (undefined8 *)*puVar8;
  }
  local_e8 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f0,(ulong)(from->_M_dataplus)._M_p);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_140 = *puVar10;
    uStack_138 = (undefined4)plVar7[3];
    uStack_134 = *(undefined4 *)((long)plVar7 + 0x1c);
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar10;
    local_150 = (ulong *)*plVar7;
  }
  local_148 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\" \"","");
  uVar14 = 0xf;
  if (local_150 != &local_140) {
    uVar14 = local_140;
  }
  if (uVar14 < (ulong)(local_88 + local_148)) {
    uVar14 = 0xf;
    if (local_90 != local_80) {
      uVar14 = local_80[0];
    }
    if (uVar14 < (ulong)(local_88 + local_148)) goto LAB_00119fc5;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_00119fc5:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_90);
  }
  local_190 = &local_180;
  puVar11 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar11) {
    local_180 = *puVar11;
    uStack_178 = puVar8[3];
  }
  else {
    local_180 = *puVar11;
    local_190 = (undefined8 *)*puVar8;
  }
  local_188 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)(to->_M_dataplus)._M_p)
  ;
  paVar2 = &local_170.field_2;
  puVar10 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_170.field_2._M_allocated_capacity = *puVar10;
    local_170.field_2._8_8_ = plVar7[3];
    local_170._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_170.field_2._M_allocated_capacity = *puVar10;
    local_170._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_170._M_string_length = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\"","");
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar2) {
    uVar13 = local_170.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_a8 + local_170._M_string_length) {
    uVar14 = 0xf;
    if (local_b0 != local_a0) {
      uVar14 = local_a0[0];
    }
    if (uVar14 < local_a8 + local_170._M_string_length) goto LAB_0011a0f7;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_b0,0,(char *)0x0,(ulong)local_170._M_dataplus._M_p);
  }
  else {
LAB_0011a0f7:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_b0);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  psVar1 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_d0.field_2._M_allocated_capacity = *psVar1;
    local_d0.field_2._8_8_ = puVar8[3];
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar1;
    local_d0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_d0._M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  sVar3 = from->_M_string_length;
  if (sVar3 == to->_M_string_length) {
    if (sVar3 != 0) {
      iVar6 = bcmp((from->_M_dataplus)._M_p,(to->_M_dataplus)._M_p,sVar3);
      if (iVar6 != 0) goto LAB_0011a240;
    }
  }
  else {
LAB_0011a240:
    iVar6 = systemp(&local_d0);
    if (iVar6 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\n\nError : An error occured while trying to copy file ",
                 0x35);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(from->_M_dataplus)._M_p,from->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," to ",4);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(to->_M_dataplus)._M_p,to->_M_string_length);
      std::endl<char,std::char_traits<char>>(poVar9);
      goto LAB_0011a45c;
    }
  }
  local_150 = &local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"chmod +w \"","");
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_150,(ulong)(to->_M_dataplus)._M_p);
  puVar11 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar11) {
    local_180 = *puVar11;
    uStack_178 = puVar8[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar11;
    local_190 = (undefined8 *)*puVar8;
  }
  local_188 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
  puVar10 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_170.field_2._M_allocated_capacity = *puVar10;
    local_170.field_2._8_8_ = puVar8[3];
    local_170._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_170.field_2._M_allocated_capacity = *puVar10;
    local_170._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_170._M_string_length = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  iVar6 = systemp(&local_170);
  if (iVar6 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "\n\nError : An error occured while trying to set write permissions on file ",0x49);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(to->_M_dataplus)._M_p,to->_M_string_length);
  std::endl<char,std::char_traits<char>>(poVar9);
LAB_0011a45c:
  exit(1);
}

Assistant:

void copyFile(const string& from, const string& to)
{
    bool override = Settings::canOverwriteFiles();
    if( from != to && !override )
    {
        if(fileExists( to ))
        {
            cerr << "\n\nError : File " << to.c_str() << " already exists. Remove it or enable overwriting." << endl;
            exit(1);
        }
    }

    string override_permission = string(override ? "-f " : "-n ");
        
    // copy file to local directory
    string command = string("cp ") + override_permission + string("\"") + from + string("\" \"") + to + string("\"");
    if( from != to && systemp( command ) != 0 )
    {
        cerr << "\n\nError : An error occured while trying to copy file " << from << " to " << to << endl;
        exit(1);
    }
    
    // give it write permission
    string command2 = string("chmod +w \"") + to + "\"";
    if( systemp( command2 ) != 0 )
    {
        cerr << "\n\nError : An error occured while trying to set write permissions on file " << to << endl;
        exit(1);
    }
}